

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall
pugi::xml_node::insert_copy_after(xml_node *this,xml_attribute *proto,xml_attribute *attr)

{
  xml_attribute xVar1;
  char_t *pcVar2;
  char *rhs;
  xml_attribute result;
  xml_attribute local_20;
  
  if (proto->_attr == (xml_attribute_struct *)0x0) {
    xml_attribute::xml_attribute(&local_20);
  }
  else {
    pcVar2 = proto->_attr->name;
    if (pcVar2 == (char_t *)0x0) {
      pcVar2 = "";
    }
    xVar1 = insert_attribute_after(this,pcVar2,attr);
    rhs = "";
    if (proto->_attr != (xml_attribute_struct *)0x0) {
      pcVar2 = proto->_attr->value;
      rhs = "";
      if (pcVar2 != (char_t *)0x0) {
        rhs = pcVar2;
      }
    }
    local_20 = xVar1;
    xml_attribute::set_value(&local_20,rhs);
    local_20 = xVar1;
  }
  return (xml_attribute)local_20._attr;
}

Assistant:

PUGI__FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}